

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O1

void __thiscall
t_ocaml_generator::generate_service_interface(t_ocaml_generator *this,t_service *tservice)

{
  int *piVar1;
  pointer pcVar2;
  char *pcVar3;
  long lVar4;
  t_ocaml_generator *this_00;
  int iVar5;
  ostream *poVar6;
  pointer pptVar7;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_100;
  ofstream_with_content_based_conditional_update *local_e0;
  ofstream_with_content_based_conditional_update *local_d8;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  char *local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  string local_90;
  t_ocaml_generator *local_70;
  char *local_68;
  long local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  vector<t_function_*,_std::allocator<t_function_*>_> local_48;
  
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  local_d8 = &this->f_service_;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_service_,local_100._M_dataplus._M_p,
                      local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"class virtual iface =",0x15);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"object (self)",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  local_e0 = &this->f_service_i_;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_service_i_,local_100._M_dataplus._M_p,
                      local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"class virtual iface :",0x15);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"object",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_100,this,&tservice->extends_->super_t_type);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"inherit ",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_100._M_dataplus._M_p,local_100._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".iface",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"inherit ",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_100._M_dataplus._M_p,local_100._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".iface",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_48,&tservice->functions_);
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar7 = local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_70 = this;
    do {
      function_type_abi_cxx11_(&local_100,this,*pptVar7,true,true);
      t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_d8,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method virtual ",0xf);
      pcVar2 = ((*pptVar7)->name_)._M_dataplus._M_p;
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + ((*pptVar7)->name_)._M_string_length);
      pcVar3 = local_b0;
      iVar5 = tolower((int)*local_b0);
      *pcVar3 = (char)iVar5;
      lVar4 = local_a8;
      if (local_b0 == &local_a0) {
        uStack_b8 = uStack_98;
        local_d0 = &local_c0;
      }
      else {
        local_d0 = local_b0;
      }
      _local_c0 = CONCAT71(uStack_9f,local_a0);
      local_c8 = local_a8;
      local_a8 = 0;
      local_a0 = '\0';
      local_b0 = &local_a0;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
      this_00 = local_70;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," : ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this_00);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_e0,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method virtual ",0xf);
      pcVar2 = ((*pptVar7)->name_)._M_dataplus._M_p;
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + ((*pptVar7)->name_)._M_string_length);
      pcVar3 = local_68;
      iVar5 = tolower((int)*local_68);
      *pcVar3 = (char)iVar5;
      lVar4 = local_60;
      if (local_68 == &local_58) {
        uStack_b8 = uStack_50;
        local_d0 = &local_c0;
      }
      else {
        local_d0 = local_68;
      }
      _local_c0 = CONCAT71(uStack_57,local_58);
      local_c8 = local_60;
      local_60 = 0;
      local_58 = '\0';
      local_68 = &local_58;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
      this = local_70;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," : ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      if (local_68 != &local_58) {
        operator_delete(local_68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_service_interface(t_service* tservice) {
  f_service_ << indent() << "class virtual iface =" << endl << "object (self)" << endl;
  f_service_i_ << indent() << "class virtual iface :" << endl << "object" << endl;

  indent_up();

  if (tservice->get_extends() != nullptr) {
    string extends = type_name(tservice->get_extends());
    indent(f_service_) << "inherit " << extends << ".iface" << endl;
    indent(f_service_i_) << "inherit " << extends << ".iface" << endl;
  }

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string ft = function_type(*f_iter, true, true);
    f_service_ << indent() << "method virtual " << decapitalize((*f_iter)->get_name()) << " : "
               << ft << endl;
    f_service_i_ << indent() << "method virtual " << decapitalize((*f_iter)->get_name()) << " : "
                 << ft << endl;
  }
  indent_down();
  indent(f_service_) << "end" << endl << endl;
  indent(f_service_i_) << "end" << endl << endl;
}